

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall TlbExport::save(TlbExport *this,ostream *stream,RegistryIterator *type)

{
  bool bVar1;
  ostream *poVar2;
  TlbExportVisitor exporter;
  string sStack_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [48];
  string local_38 [32];
  
  bVar1 = Typelib::RegistryIterator::isAlias(type);
  if (bVar1) {
    poVar2 = std::operator<<(stream,"  <alias name=\"");
    Typelib::RegistryIterator::getName_abi_cxx11_(&local_a8,type);
    anon_unknown.dwarf_52dd::xmlEscape((string *)local_68,&local_a8);
    poVar2 = std::operator<<(poVar2,(string *)local_68);
    poVar2 = std::operator<<(poVar2,"\" source=\"");
    Typelib::Type::getName_abi_cxx11_();
    anon_unknown.dwarf_52dd::xmlEscape(&sStack_c8,&local_88);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_c8);
    std::operator<<(poVar2,"\"/>\n");
    std::__cxx11::string::~string((string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    std::operator<<(stream,"  ");
    std::__cxx11::string::string((string *)&local_a8,"  ",(allocator *)&local_88);
    Typelib::RegistryIterator::getSource_abi_cxx11_(&sStack_c8,type);
    local_68._0_8_ = &PTR_visit__00113690;
    local_68._8_8_ = stream;
    std::__cxx11::string::string((string *)(local_68 + 0x10),(string *)&local_a8);
    std::__cxx11::string::string(local_38,(string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    Typelib::TypeVisitor::apply((Type *)local_68);
    std::operator<<(stream,"\n");
    anon_unknown.dwarf_52dd::TlbExportVisitor::~TlbExportVisitor((TlbExportVisitor *)local_68);
  }
  return true;
}

Assistant:

bool TlbExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (type.isAlias())
    {
        stream << "  <alias "
            "name=\"" << xmlEscape(type.getName()) << "\" "
            "source=\"" << xmlEscape(type->getName()) << "\"/>\n";
    }
    else
    {
        stream << "  ";
        TlbExportVisitor exporter(stream, "  ", type.getSource());
        exporter.apply(*type);
        stream << "\n";
    }
    return true;
}